

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.h
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::LayerHeader::LayerHeader(LayerHeader *this,LayerHeader *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  LayerHeader *param_1_local;
  LayerHeader *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__LayerHeader_0033bef8;
  KVar1 = param_1->m_ui8LayerSpecificInfo;
  KVar2 = param_1->m_ui16LayerLength;
  this->m_ui8LayerNumber = param_1->m_ui8LayerNumber;
  this->m_ui8LayerSpecificInfo = KVar1;
  this->m_ui16LayerLength = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT LayerHeader : public DataTypeBase
{
protected:

    KUINT8 m_ui8LayerNumber;

    KUINT8 m_ui8LayerSpecificInfo;

    KUINT16 m_ui16LayerLength;

public:

    static const KUINT16 LAYER_HEADER_SIZE = 4;

    LayerHeader();

    LayerHeader(KDataStream &stream) noexcept(false);

    LayerHeader( KUINT8 LayerNumber, KUINT8 LayerSpecificInfo, KUINT16 LayerLength );

    virtual ~LayerHeader();

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::SetLayerNumber
    //              KDIS::DATA_TYPE::LayerHeader::GetLayerNumber
    // Description: Identifies the layer.
    // Parameter:   KUINT8 LN
    //************************************
    void SetLayerNumber( KUINT8 LN );
    KUINT8 GetLayerNumber() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::SetLayerSpecificInfomation
    //              KDIS::DATA_TYPE::LayerHeader::GetLayerSpecificInfomation
    // Description: This value varies by system type and layer number. Represented by an
    //              enumeration however no values has been defined(as of SISO-REF-10-2006) other than 0 = Other.
    // Parameter:   KUINT8 LSI
    //************************************
    void SetLayerSpecificInfomation( KUINT8 LSI );
    KUINT8 GetLayerSpecificInfomation() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::SetLayerLength
    //              KDIS::DATA_TYPE::LayerHeader::GetLayerLength
    // Description: Specifies the length in octets of the layer including the layer header.
    // Parameter:   KUINT16 L
    //************************************
    void SetLayerLength( KUINT16 L );
    KUINT16 GetLayerLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::LayerHeader::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const LayerHeader & Value ) const;
    KBOOL operator != ( const LayerHeader & Value ) const;
}